

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab10.c
# Opt level: O0

int FeederBigTriangle(void)

{
  DWORD DVar1;
  int iVar2;
  DWORD DVar3;
  uint uVar4;
  FILE *__stream;
  uint local_28;
  uint local_24;
  int y;
  int x;
  int i;
  DWORD t;
  FILE *in;
  
  __stream = fopen("in.txt","w");
  if (__stream == (FILE *)0x0) {
    printf("can\'t create in.txt. No space on disk?\n");
    in._4_4_ = -1;
  }
  else {
    printf("Creating big triangle... ");
    fflush(_stdout);
    DVar1 = GetTickCount();
    fprintf(__stream,"%d\n",100000);
    fprintf(__stream,"%d %d\n",0x80000000);
    for (y = 0; y < 99999; y = y + 1) {
      local_24 = 0x7fffffff;
      local_28 = 0x7fffffff;
      if (bigTrianglesN == 1) {
        local_28 = 0x7fffffff - y;
      }
      else if (bigTrianglesN == 2) {
        local_24 = 0x7fffffff - y;
      }
      iVar2 = fprintf(__stream,"%d %d\n",(ulong)local_24,(ulong)local_28);
      if (iVar2 < 2) {
        fclose(__stream);
        printf("can\'t create in.txt. No space on disk?\n");
        return -1;
      }
    }
    DVar3 = GetTickCount();
    uVar4 = RoundUptoThousand(DVar3 - DVar1);
    printf("done in T=%u seconds. Starting exe with timeout 2*T+2... ",(ulong)uVar4 / 1000,
           (ulong)uVar4 % 1000);
    LabTimeout = uVar4 * 2 + 2000;
    LabMemoryLimit = 0x649f00;
    fflush(_stdout);
    fclose(__stream);
    in._4_4_ = 0;
  }
  return in._4_4_;
}

Assistant:

static int FeederBigTriangle(void)
{
    FILE *const in = fopen("in.txt", "w");
    if (!in) {
        printf("can't create in.txt. No space on disk?\n");
        return -1;
    }

    printf("Creating big triangle... ");
    fflush(stdout);
    DWORD t = GetTickCount();
    fprintf(in, "%d\n", MAX_POINT_COUNT);
    fprintf(in, "%d %d\n", INT_MIN, INT_MIN);

    for (int i = 0; i < MAX_POINT_COUNT - 1; ++i) {
        int x = INT_MAX;
        int y = INT_MAX;
        if (bigTrianglesN == 1) {
            y -= i;
        }
        else if (bigTrianglesN == 2) {
            x -= i;
        }

        if (fprintf(in, "%d %d\n", x, y) < 2) {
            fclose(in);
            printf("can't create in.txt. No space on disk?\n");
            return -1;
        }
    }

    t = RoundUptoThousand(GetTickCount() - t);
    printf("done in T=%u seconds. Starting exe with timeout 2*T+2... ", (unsigned)t/1000);
    LabTimeout = (int)t*2+2000;
    LabMemoryLimit = MIN_PROCESS_RSS_BYTES + 3*sizeof(TPoint)*MAX_POINT_COUNT;
    fflush(stdout);
    fclose(in);

    return 0;    
}